

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O0

MPP_RET hal_h264e_vepu540c_prepare(void *hal)

{
  long lVar1;
  int local_24;
  RK_S32 i;
  MppEncPrepCfg *prep;
  HalH264eVepu540cCtx *ctx;
  void *hal_local;
  
  lVar1 = *hal;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_prepare",hal);
  }
  if ((*(uint *)(lVar1 + 8) & 5) != 0) {
    setup_hal_bufs((HalH264eVepu540cCtx *)hal);
    for (local_24 = 0; local_24 < *(int *)((long)hal + 0x30); local_24 = local_24 + 1) {
      hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x18),local_24);
    }
    *(uint *)(lVar1 + 8) = 0;
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_prepare",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_prepare(void *hal)
{
    HalH264eVepu540cCtx *ctx = (HalH264eVepu540cCtx *)hal;
    MppEncPrepCfg *prep = &ctx->cfg->prep;

    hal_h264e_dbg_func("enter %p\n", hal);

    if (prep->change & (MPP_ENC_PREP_CFG_CHANGE_INPUT | MPP_ENC_PREP_CFG_CHANGE_FORMAT)) {
        RK_S32 i;

        // pre-alloc required buffers to reduce first frame delay
        setup_hal_bufs(ctx);
        for (i = 0; i < ctx->max_buf_cnt; i++)
            hal_bufs_get_buf(ctx->hw_recn, i);

        prep->change = 0;
    }

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}